

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall
r_exec::InputLessPGMController::InputLessPGMController(InputLessPGMController *this,View *ipgm_view)

{
  InputLessPGMOverlay *this_00;
  P<r_exec::Overlay> local_20;
  View *local_18;
  View *ipgm_view_local;
  InputLessPGMController *this_local;
  
  local_18 = ipgm_view;
  ipgm_view_local = (View *)this;
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__InputLessPGMController_002ecea0;
  std::mutex::mutex(&this->m_hostMutex);
  this_00 = (InputLessPGMOverlay *)operator_new(0x80);
  InputLessPGMOverlay::InputLessPGMOverlay(this_00,(Controller *)this);
  core::P<r_exec::Overlay>::P(&local_20,(Overlay *)this_00);
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  core::P<r_exec::Overlay>::~P(&local_20);
  return;
}

Assistant:

InputLessPGMController::InputLessPGMController(r_code::View *ipgm_view): _PGMController(ipgm_view)
{
    overlays.push_back(new InputLessPGMOverlay(this));
}